

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfileio.c
# Opt level: O3

int ffrtnm(char *url,char *rootname,int *status)

{
  char cVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  char *pcVar6;
  char *__s;
  ulong uVar7;
  ulong uVar8;
  ushort **ppuVar9;
  size_t sVar10;
  int iVar11;
  char *pcVar12;
  char urltype [20];
  char infile [1025];
  char local_458 [8];
  undefined2 auStack_450 [11];
  char acStack_43a [1034];
  
  if (0 < *status) {
    return *status;
  }
  *rootname = '\0';
  local_458[0] = '\0';
  acStack_43a[2] = 0;
  if (*url == '-') {
    sVar4 = strlen(local_458);
    (local_458 + sVar4)[0] = '-';
    (local_458 + sVar4)[1] = '\0';
    pcVar12 = url + 1;
  }
  else {
    iVar2 = strncmp(url,"stdin",5);
    if ((iVar2 == 0) || (iVar2 = strncmp(url,"STDIN",5), iVar2 == 0)) {
      sVar4 = strlen(local_458);
      (local_458 + sVar4)[0] = '-';
      (local_458 + sVar4)[1] = '\0';
LAB_0012fd5e:
      pcVar12 = url + 5;
    }
    else {
      pcVar5 = strstr(url,"://");
      pcVar6 = strchr(url,0x28);
      pcVar12 = (char *)0x0;
      if (pcVar5 <= pcVar6) {
        pcVar12 = pcVar5;
      }
      if (pcVar6 == (char *)0x0) {
        pcVar12 = pcVar5;
      }
      if (pcVar12 == (char *)0x0) {
        iVar2 = strncmp(url,"ftp:",4);
        if (iVar2 == 0) {
          sVar4 = strlen(local_458);
          builtin_strncpy(local_458 + sVar4,"ftp:",4);
LAB_0013005e:
          builtin_strncpy(local_458 + sVar4 + 3,"://",4);
          pcVar12 = url + 4;
        }
        else {
          iVar2 = strncmp(url,"gsiftp:",7);
          if (iVar2 == 0) {
            sVar4 = strlen(local_458);
            builtin_strncpy(local_458 + sVar4,"gsiftp:/",8);
            *(undefined2 *)((long)auStack_450 + sVar4) = 0x2f;
            pcVar12 = url + 7;
          }
          else {
            iVar2 = strncmp(url,"http:",5);
            if (iVar2 == 0) {
              sVar4 = strlen(local_458);
              builtin_strncpy(local_458 + sVar4,"http://",8);
              goto LAB_0012fd5e;
            }
            iVar2 = strncmp(url,"mem:",4);
            if (iVar2 == 0) {
              sVar4 = strlen(local_458);
              builtin_strncpy(local_458 + sVar4,"mem:",4);
              goto LAB_0013005e;
            }
            iVar2 = strncmp(url,"shmem:",6);
            if (iVar2 == 0) {
              sVar4 = strlen(local_458);
              builtin_strncpy(local_458 + sVar4,"shmem://",8);
              *(undefined1 *)((long)auStack_450 + sVar4) = 0;
              pcVar12 = url + 6;
            }
            else {
              iVar2 = strncmp(url,"file:",5);
              pcVar12 = url + (ulong)(iVar2 == 0) * 5;
            }
          }
        }
      }
      else {
        if (0x10 < (long)pcVar12 - (long)url) goto LAB_00130016;
        strncat(local_458,url,((long)pcVar12 - (long)url) + 3);
        pcVar12 = pcVar12 + 3;
      }
    }
  }
  pcVar5 = strchr(pcVar12,0x28);
  pcVar6 = strchr(pcVar12,0x5b);
  if (pcVar5 == (char *)0x0) {
    pcVar5 = (char *)0x0;
  }
  else {
    __s = strchr(pcVar5,0x29);
    if (__s != (char *)0x0) {
      while( true ) {
        do {
          cVar1 = __s[1];
          __s = __s + 1;
        } while (cVar1 == ' ');
        if ((cVar1 == '\0') || (cVar1 == '[')) break;
        pcVar5 = strchr(pcVar5 + 1,0x28);
        __s = strchr(__s,0x29);
        if ((__s == (char *)0x0) || (pcVar5 == (char *)0x0)) break;
      }
    }
  }
  if (pcVar5 == pcVar6) {
    sVar4 = strlen(pcVar12);
    if (0x400 < sVar4) goto LAB_00130016;
    strcat(acStack_43a + 2,pcVar12);
  }
  else if ((pcVar6 == (char *)0x0) || (pcVar5 < pcVar6 && pcVar5 != (char *)0x0)) {
    if (0x400 < (long)pcVar5 - (long)pcVar12) goto LAB_00130016;
    strncat(acStack_43a + 2,pcVar12,(long)pcVar5 - (long)pcVar12);
    pcVar12 = strchr(pcVar5 + 1,0x29);
    if (pcVar12 == (char *)0x0) goto LAB_00130016;
  }
  else {
    if (0x400 < (long)pcVar6 - (long)pcVar12) goto LAB_00130016;
    strncat(acStack_43a + 2,pcVar12,(long)pcVar6 - (long)pcVar12);
  }
  sVar4 = strlen(acStack_43a + 2);
  if (1 < (int)(uint)sVar4) {
    uVar7 = (ulong)((uint)sVar4 & 0x7fffffff) + 1;
    do {
      if (acStack_43a[uVar7] != ' ') break;
      acStack_43a[uVar7] = '\0';
      uVar7 = uVar7 - 1;
    } while (2 < uVar7);
  }
  sVar4 = strlen(acStack_43a + 2);
  iVar11 = (int)sVar4;
  iVar2 = 0;
  uVar7 = sVar4 & 0xffffffff;
  do {
    uVar8 = uVar7;
    if ((int)uVar8 < 1) goto LAB_0012fff6;
    uVar7 = uVar8 - 1;
    iVar2 = iVar2 + 1;
  } while (acStack_43a[uVar8 + 1] != '+');
  if (iVar2 < 5 && uVar7 != 0) {
    iVar3 = (iVar11 - iVar2) + 1;
    if (iVar3 < iVar11) {
      pcVar12 = acStack_43a + uVar8 + 2;
      ppuVar9 = __ctype_b_loc();
      iVar3 = (iVar11 - iVar2) + 1;
      do {
        if ((*(byte *)((long)*ppuVar9 + (long)*pcVar12 * 2 + 1) & 8) == 0) goto LAB_0012ffe9;
        iVar3 = iVar3 + 1;
        pcVar12 = pcVar12 + 1;
      } while (iVar3 < iVar11);
    }
    else {
LAB_0012ffe9:
      if (iVar3 != iVar11) goto LAB_0012fff6;
    }
    acStack_43a[(uVar7 & 0xffffffff) + 2] = '\0';
  }
LAB_0012fff6:
  sVar4 = strlen(local_458);
  sVar10 = strlen(acStack_43a + 2);
  if (sVar10 + sVar4 < 0x401) {
    strcat(rootname,local_458);
    strcat(rootname,acStack_43a + 2);
    return *status;
  }
LAB_00130016:
  *status = 0x7d;
  return 0x7d;
}

Assistant:

int ffrtnm(char *url, 
           char *rootname,
           int *status)
/*
   parse the input URL, returning the root name (filetype://basename).
*/

{ 
    int ii, jj, slen, infilelen;
    char *ptr1, *ptr2, *ptr3, *ptr4;
    char urltype[MAX_PREFIX_LEN];
    char infile[FLEN_FILENAME];

    if (*status > 0)
        return(*status);

    ptr1 = url;
    *rootname = '\0';
    *urltype = '\0';
    *infile  = '\0';

    /*  get urltype (e.g., file://, ftp://, http://, etc.)  */
    if (*ptr1 == '-')        /* "-" means read file from stdin */
    {
        strcat(urltype, "-");
        ptr1++;
    }
    else if (!strncmp(ptr1, "stdin", 5) || !strncmp(ptr1, "STDIN", 5))
    {
        strcat(urltype, "-");
        ptr1 = ptr1 + 5;
    }
    else
    {
        ptr2 = strstr(ptr1, "://");
        ptr3 = strstr(ptr1, "(" );

        if (ptr3 && (ptr3 < ptr2) )
        {
           /* the urltype follows a '(' character, so it must apply */
           /* to the output file, and is not the urltype of the input file */
           ptr2 = 0;   /* so reset pointer to zero */
        }


        if (ptr2)                  /* copy the explicit urltype string */ 
        {

	   if (ptr2 - ptr1 + 3 > MAX_PREFIX_LEN - 1)
	   {
               return(*status = URL_PARSE_ERROR);
           }
            strncat(urltype, ptr1, ptr2 - ptr1 + 3);
            ptr1 = ptr2 + 3;
        }
        else if (!strncmp(ptr1, "ftp:", 4) )
        {                              /* the 2 //'s are optional */
            strcat(urltype, "ftp://");
            ptr1 += 4;
        }
        else if (!strncmp(ptr1, "gsiftp:", 7) )
        {                              /* the 2 //'s are optional */
            strcat(urltype, "gsiftp://");
            ptr1 += 7;
        }
        else if (!strncmp(ptr1, "http:", 5) )
        {                              /* the 2 //'s are optional */
            strcat(urltype, "http://");
            ptr1 += 5;
        }
        else if (!strncmp(ptr1, "mem:", 4) )
        {                              /* the 2 //'s are optional */
            strcat(urltype, "mem://");
            ptr1 += 4;
        }
        else if (!strncmp(ptr1, "shmem:", 6) )
        {                              /* the 2 //'s are optional */
            strcat(urltype, "shmem://");
            ptr1 += 6;
        }
        else if (!strncmp(ptr1, "file:", 5) )
        {                              /* the 2 //'s are optional */
            ptr1 += 5;
        }

        /* else assume file driver    */
    }
 
       /*  get the input file name  */
    ptr2 = strchr(ptr1, '(');   /* search for opening parenthesis ( */
    ptr3 = strchr(ptr1, '[');   /* search for opening bracket [ */
    if (ptr2)
    {
       ptr4 = strchr(ptr2, ')');
       while (ptr4 && ptr2)
       {
          do {
             ++ptr4;
          }  while (*ptr4 == ' ');
          if (*ptr4 == 0 || *ptr4 == '[')
             break;
          ptr2 = strchr(ptr2+1, '(');
          ptr4 = strchr(ptr4, ')');
       }
    }

    if (ptr2 == ptr3)  /* simple case: no [ or ( in the file name */
    {

	if (strlen(ptr1) > FLEN_FILENAME - 1)
        {
            return(*status = URL_PARSE_ERROR);
        }

        strcat(infile, ptr1);
    }
    else if (!ptr3)     /* no bracket, so () enclose output file name */
    {

	if (ptr2 - ptr1 > FLEN_FILENAME - 1)
        {
            return(*status = URL_PARSE_ERROR);
        }

        strncat(infile, ptr1, ptr2 - ptr1);
        ptr2++;

        ptr1 = strchr(ptr2, ')' );   /* search for closing ) */
        if (!ptr1)
            return(*status = URL_PARSE_ERROR);  /* error, no closing ) */

    }
    else if (ptr2 && (ptr2 < ptr3)) /* () enclose output name before bracket */
    {

	if (ptr2 - ptr1 > FLEN_FILENAME - 1)
        {
            return(*status = URL_PARSE_ERROR); 
        }

        strncat(infile, ptr1, ptr2 - ptr1);
        ptr2++;

        ptr1 = strchr(ptr2, ')' );   /* search for closing ) */
        if (!ptr1)
            return(*status = URL_PARSE_ERROR);  /* error, no closing ) */
    }
    else    /*   bracket comes first, so there is no output name */
    {
	if (ptr3 - ptr1 > FLEN_FILENAME - 1)
        {
            return(*status = URL_PARSE_ERROR); 
        }

        strncat(infile, ptr1, ptr3 - ptr1);
    }

       /* strip off any trailing blanks in the names */
    slen = strlen(infile);
    for (ii = slen - 1; ii > 0; ii--)   
    {
        if (infile[ii] == ' ')
            infile[ii] = '\0';
        else
            break;
    }

    /* --------------------------------------------- */
    /* check if the 'filename+n' convention has been */
    /* used to specifiy which HDU number to open     */ 
    /* --------------------------------------------- */

    jj = strlen(infile);

    for (ii = jj - 1; ii >= 0; ii--)
    {
        if (infile[ii] == '+')    /* search backwards for '+' sign */
            break;
    }

    if (ii > 0 && (jj - ii) < 5)  /* limit extension numbers to 4 digits */
    {
        infilelen = ii;
        ii++;


        for (; ii < jj; ii++)
        {
            if (!isdigit((int) infile[ii] ) ) /* are all the chars digits? */
                break;
        }

        if (ii == jj)      
        {
             /* yes, the '+n' convention was used.  */

             infile[infilelen] = '\0'; /* delete the extension number */
        }
    }

    if (strlen(urltype) + strlen(infile) > FLEN_FILENAME - 1)
    {
            return(*status = URL_PARSE_ERROR); 
    }

    strcat(rootname, urltype);  /* construct the root name */
    strcat(rootname, infile);

    return(*status);
}